

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O1

Am_Wrapper * __thiscall Part_Key_Offset_Store_Data::Make_Unique(Part_Key_Offset_Store_Data *this)

{
  uint uVar1;
  Part_Key_Offset_Store_Data *pPVar2;
  
  uVar1 = (this->super_Am_Wrapper).refs;
  pPVar2 = this;
  if (uVar1 != 1) {
    uVar1 = uVar1 - 1;
    (this->super_Am_Wrapper).refs = uVar1;
    if (uVar1 == 0) {
      (*(this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])(this);
    }
    pPVar2 = (Part_Key_Offset_Store_Data *)operator_new(0x18);
    (pPVar2->super_Am_Wrapper).refs = 1;
    (pPVar2->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
         (_func_int **)&PTR_ID_002e3b30;
    *(undefined2 *)&(pPVar2->super_Am_Wrapper).field_0xc =
         *(undefined2 *)&(this->super_Am_Wrapper).field_0xc;
    *(undefined2 *)&(pPVar2->super_Am_Wrapper).field_0xe =
         *(undefined2 *)&(this->super_Am_Wrapper).field_0xe;
    pPVar2->offset = this->offset;
    pPVar2->multiplier = this->multiplier;
  }
  return &pPVar2->super_Am_Wrapper;
}

Assistant:

static Am_Value
offset_from_part_procedure(Am_Object &self)
{
  Am_Value value;
  Part_Key_Offset_Store_Data *store =
      (Part_Key_Offset_Store_Data *)Am_Object_Advanced::Get_Context()
          ->Get_Data();
  value = self.Get_Object(store->part).Get(store->key);
  store->Release();
  modify_value(value, store->offset, store->multiplier);
  return value;
}